

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

void __thiscall
QPlainTextEditPrivate::repaintContents(QPlainTextEditPrivate *this,QRectF *contentsRect)

{
  QWidget *this_00;
  QScrollBar *this_01;
  LayoutDirection LVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  qreal qVar4;
  undefined1 auVar5 [16];
  QRectF local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((contentsRect->w <= 0.0) || (contentsRect->h <= 0.0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      updateViewport(this);
      return;
    }
  }
  else {
    this_00 = *(QWidget **)
               &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
                field_0x8;
    LVar1 = QWidget::layoutDirection(this_00);
    this_01 = (this->super_QAbstractScrollAreaPrivate).hbar;
    if (LVar1 == RightToLeft) {
      iVar2 = QAbstractSlider::maximum(&this_01->super_QAbstractSlider);
      iVar3 = QAbstractSlider::value
                        (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
      iVar2 = iVar2 - iVar3;
    }
    else {
      iVar2 = QAbstractSlider::value(&this_01->super_QAbstractSlider);
    }
    qVar4 = verticalOffset(this,this->control->topBlock,this->topLine);
    iVar3 = (int)(qVar4 + this->topLineFracture);
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_88.xp = contentsRect->xp + -1.0;
    local_88.yp = contentsRect->yp + -1.0;
    local_88.w = contentsRect->w + 1.0 + 1.0;
    local_88.h = contentsRect->h + 1.0 + 1.0;
    QRectF::operator&(&local_58,&local_88);
    auVar5 = QRectF::toAlignedRect();
    if (auVar5._4_4_ <= auVar5._12_4_ && auVar5._0_4_ <= auVar5._8_4_) {
      local_68 = (undefined1 *)CONCAT44(auVar5._4_4_ - iVar3,auVar5._0_4_ - iVar2);
      uStack_60 = (undefined1 *)CONCAT44(auVar5._12_4_ - iVar3,auVar5._8_4_ - iVar2);
      QWidget::update((this->super_QAbstractScrollAreaPrivate).viewport,(QRect *)&local_68);
      local_88.xp = (qreal)((ulong)local_88.xp & 0xffffffff00000000);
      local_58.xp = 0.0;
      local_58.yp = (qreal)&local_68;
      local_58.w = (qreal)&local_88;
      QMetaObject::activate
                (&this_00->super_QObject,&QPlainTextEdit::staticMetaObject,6,(void **)&local_58);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEditPrivate::repaintContents(const QRectF &contentsRect)
{
    Q_Q(QPlainTextEdit);
    if (!contentsRect.isValid()) {
        updateViewport();
        return;
    }
    const int xOffset = horizontalOffset();
    const int yOffset = (int)verticalOffset();
    const QRect visibleRect(xOffset, yOffset, viewport->width(), viewport->height());

    QRect r = contentsRect.adjusted(-1, -1, 1, 1).intersected(visibleRect).toAlignedRect();
    if (r.isEmpty())
        return;

    r.translate(-xOffset, -yOffset);
    viewport->update(r);
    emit q->updateRequest(r, 0);
}